

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O3

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  byte bVar1;
  undefined1 uVar2;
  int iVar3;
  SQRESULT SVar4;
  SQInteger SVar5;
  SQChar *pSVar6;
  long lVar7;
  longlong lVar8;
  size_t sVar9;
  undefined1 auVar10 [8];
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  HSQUIRRELVM v_00;
  SQInteger ti;
  SQFloat tf;
  SQChar *ts;
  SQChar fmt [20];
  SQChar *format;
  char *local_b0;
  size_t local_a8;
  long local_a0;
  HSQUIRRELVM local_98;
  SQFloat local_8c;
  long local_88;
  undefined1 local_80 [8];
  char local_78;
  undefined1 local_77 [31];
  SQChar *local_58;
  SQInteger *local_50;
  SQChar **local_48;
  long local_40;
  SQInteger local_38;
  
  SVar4 = sq_getstring(v,nformatstringidx,&local_58);
  if (-1 < SVar4) {
    local_50 = outlen;
    local_48 = output;
    SVar5 = sq_getsize(v,nformatstringidx);
    local_a8 = SVar5 + 2;
    local_98 = v;
    pSVar6 = sq_getscratchpad(v,local_a8);
    if (0 < SVar5) {
      lVar13 = nformatstringidx + 1;
      lVar11 = 0;
      lVar16 = 0;
      local_a0 = 0;
      local_38 = SVar5;
LAB_00136288:
      v_00 = local_98;
      if (local_58[lVar16] == '%') {
        if (local_58[lVar16 + 1] == '%') {
          pSVar6[lVar11] = '%';
          lVar11 = lVar11 + 1;
          lVar16 = lVar16 + 2;
          goto LAB_00136594;
        }
        SVar5 = sq_gettop(local_98);
        pSVar6 = local_58;
        if (SVar5 < lVar13) {
          pcVar15 = "not enough parameters for the given format string";
          goto LAB_0013663d;
        }
        lVar12 = lVar16 + 1;
        local_78 = '%';
        pcVar15 = local_58 + lVar16 + 2;
        lVar16 = lVar16 + 2;
        lVar14 = lVar12;
        while (((ulong)(byte)local_58[lVar14] < 0x31 &&
               ((0x1280900000000U >> ((ulong)(byte)local_58[lVar14] & 0x3f) & 1) != 0))) {
          lVar14 = lVar14 + 1;
          lVar16 = lVar16 + 1;
          pcVar15 = pcVar15 + 1;
        }
        lVar7 = 0;
        do {
          local_88 = lVar13;
          if (9 < (int)local_58[lVar14] - 0x30U) {
            *(undefined1 *)((long)&local_b0 + lVar7) = 0;
            if (lVar7 == 0) {
              local_a0 = 0;
            }
            else {
              local_40 = lVar12;
              local_a0 = strtoll((char *)&local_b0,(char **)local_80,10);
              lVar12 = local_40;
            }
            lVar13 = local_88;
            v_00 = local_98;
            if (pSVar6[lVar14] != '.') goto LAB_00136402;
            lVar7 = 0;
            goto LAB_0013639b;
          }
          *(SQChar *)((long)&local_b0 + lVar7) = local_58[lVar14];
          lVar14 = lVar14 + 1;
          lVar7 = lVar7 + 1;
          lVar16 = lVar16 + 1;
          pcVar15 = pcVar15 + 1;
        } while (lVar7 != 3);
        pcVar15 = "width format too long";
LAB_00136420:
        v_00 = local_98;
        lVar14 = sq_throwerror(local_98,pcVar15);
        lVar13 = local_88;
        goto LAB_00136452;
      }
      if ((long)local_a8 <= lVar11) {
        __assert_fail("i < allocated",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/sqstdlib/sqstdstring.cpp"
                      ,0x54,"SQRESULT sqstd_format(HSQUIRRELVM, SQInteger, SQInteger *, SQChar **)")
        ;
      }
      pSVar6[lVar11] = local_58[lVar16];
      lVar11 = lVar11 + 1;
      lVar16 = lVar16 + 1;
      goto LAB_00136594;
    }
    lVar11 = 0;
LAB_001365f2:
    *local_50 = lVar11;
    pSVar6[lVar11] = '\0';
    *local_48 = pSVar6;
    SVar4 = 0;
  }
  return SVar4;
LAB_0013639b:
  if ((int)*pcVar15 - 0x30U < 10) goto code_r0x001363a8;
  *(undefined1 *)((long)&local_b0 + lVar7) = 0;
  lVar14 = lVar16;
  if (lVar7 != 0) {
    lVar8 = strtoll((char *)&local_b0,(char **)local_80,10);
    local_a0 = local_a0 + lVar8;
  }
LAB_00136402:
  v_00 = local_98;
  lVar13 = lVar14 - lVar12;
  if (0x14 < lVar13) {
    pcVar15 = "format too long";
    goto LAB_00136420;
  }
  memcpy(local_77,pSVar6 + lVar12,lVar13 + 1);
  local_77[lVar13 + 1] = 0;
  lVar13 = local_88;
  goto LAB_00136452;
code_r0x001363a8:
  *(char *)((long)&local_b0 + lVar7) = *pcVar15;
  lVar7 = lVar7 + 1;
  lVar16 = lVar16 + 1;
  pcVar15 = pcVar15 + 1;
  if (lVar7 == 3) goto code_r0x001363bb;
  goto LAB_0013639b;
code_r0x001363bb:
  lVar14 = sq_throwerror(local_98,"precision format too long");
LAB_00136452:
  if (lVar14 < 0) {
    return -1;
  }
  local_80 = (undefined1  [8])0x0;
  local_b0 = (char *)0x0;
  local_8c = 0.0;
  bVar1 = local_58[lVar14];
  if (bVar1 < 99) {
    if ((bVar1 == 0x45) || (bVar1 == 0x47)) {
switchD_0013649c_caseD_65:
      SVar4 = sq_getfloat(v_00,lVar13,&local_8c);
      if (-1 < SVar4) {
        sVar9 = local_a8 + local_a0 + 0x66;
        pSVar6 = sq_getscratchpad(v_00,sVar9);
        local_a8 = sVar9;
        iVar3 = snprintf(pSVar6 + lVar11,sVar9,&local_78,(double)local_8c);
        goto LAB_00136581;
      }
      pcVar15 = "float expected for the specified format";
      goto LAB_0013663d;
    }
    if (bVar1 != 0x58) goto switchD_0013649c_caseD_68;
switchD_0013649c_caseD_64:
    sVar9 = strlen(&local_78);
    uVar2 = local_80[sVar9 + 7];
    *(undefined2 *)(local_80 + sVar9 + 7) = 0x6c6c;
    local_77[sVar9] = uVar2;
    local_77[sVar9 + 1] = 0;
    goto switchD_0013649c_caseD_63;
  }
  switch(bVar1) {
  case 99:
switchD_0013649c_caseD_63:
    SVar4 = sq_getinteger(v_00,lVar13,(SQInteger *)&local_b0);
    if (SVar4 < 0) {
      pcVar15 = "integer expected for the specified format";
LAB_0013663d:
      SVar4 = sq_throwerror(v_00,pcVar15);
      return SVar4;
    }
    sVar9 = local_a8 + local_a0 + 0x66;
    pSVar6 = sq_getscratchpad(v_00,sVar9);
    auVar10 = (undefined1  [8])local_b0;
    break;
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
    goto switchD_0013649c_caseD_64;
  case 0x65:
  case 0x66:
  case 0x67:
    goto switchD_0013649c_caseD_65;
  default:
switchD_0013649c_caseD_68:
    pcVar15 = "invalid format";
    goto LAB_0013663d;
  case 0x73:
    SVar4 = sq_getstring(v_00,lVar13,(SQChar **)local_80);
    if (SVar4 < 0) {
      pcVar15 = "string expected for the specified format";
      goto LAB_0013663d;
    }
    SVar5 = sq_getsize(v_00,lVar13);
    sVar9 = local_a8 + local_a0 + SVar5 + 2;
    pSVar6 = sq_getscratchpad(v_00,sVar9);
    auVar10 = local_80;
  }
  local_a8 = sVar9;
  iVar3 = snprintf(pSVar6 + lVar11,sVar9,&local_78,auVar10);
LAB_00136581:
  lVar11 = lVar11 + iVar3;
  lVar16 = lVar14 + 1;
  lVar13 = lVar13 + 1;
  SVar5 = local_38;
LAB_00136594:
  if (SVar5 <= lVar16) goto LAB_001365f2;
  goto LAB_00136288;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    const SQRESULT res = sq_getstring(v,nformatstringidx,&format);
    if (SQ_FAILED(res)) {
        return res; // propagate the error
    }
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = scstrlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': i += scsprintf(&dest[i],allocated,fmt,tf); break;
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}